

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  ulong in_RAX;
  size_t sVar2;
  IColourImpl *pIVar3;
  Colour colourGuard;
  undefined8 uStack_28;
  
  poVar1 = (this->super_StreamingReporterBase).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001775d0 = 0x2d2d2d2d2d2d2d;
    uRam00000000001775d7._0_1_ = '-';
    uRam00000000001775d7._1_1_ = '-';
    uRam00000000001775d7._2_1_ = '-';
    uRam00000000001775d7._3_1_ = '-';
    uRam00000000001775d7._4_1_ = '-';
    uRam00000000001775d7._5_1_ = '-';
    uRam00000000001775d7._6_1_ = '-';
    uRam00000000001775d7._7_1_ = '-';
    DAT_001775c0 = '-';
    DAT_001775c0_1._0_1_ = '-';
    DAT_001775c0_1._1_1_ = '-';
    DAT_001775c0_1._2_1_ = '-';
    DAT_001775c0_1._3_1_ = '-';
    DAT_001775c0_1._4_1_ = '-';
    DAT_001775c0_1._5_1_ = '-';
    DAT_001775c0_1._6_1_ = '-';
    uRam00000000001775c8 = 0x2d2d2d2d2d2d2d;
    DAT_001775cf = 0x2d;
    DAT_001775b0 = '-';
    DAT_001775b0_1._0_1_ = '-';
    DAT_001775b0_1._1_1_ = '-';
    DAT_001775b0_1._2_1_ = '-';
    DAT_001775b0_1._3_1_ = '-';
    DAT_001775b0_1._4_1_ = '-';
    DAT_001775b0_1._5_1_ = '-';
    DAT_001775b0_1._6_1_ = '-';
    uRam00000000001775b8._0_1_ = '-';
    uRam00000000001775b8._1_1_ = '-';
    uRam00000000001775b8._2_1_ = '-';
    uRam00000000001775b8._3_1_ = '-';
    uRam00000000001775b8._4_1_ = '-';
    uRam00000000001775b8._5_1_ = '-';
    uRam00000000001775b8._6_1_ = '-';
    uRam00000000001775b8._7_1_ = '-';
    DAT_001775a0 = '-';
    DAT_001775a0_1._0_1_ = '-';
    DAT_001775a0_1._1_1_ = '-';
    DAT_001775a0_1._2_1_ = '-';
    DAT_001775a0_1._3_1_ = '-';
    DAT_001775a0_1._4_1_ = '-';
    DAT_001775a0_1._5_1_ = '-';
    DAT_001775a0_1._6_1_ = '-';
    uRam00000000001775a8._0_1_ = '-';
    uRam00000000001775a8._1_1_ = '-';
    uRam00000000001775a8._2_1_ = '-';
    uRam00000000001775a8._3_1_ = '-';
    uRam00000000001775a8._4_1_ = '-';
    uRam00000000001775a8._5_1_ = '-';
    uRam00000000001775a8._6_1_ = '-';
    uRam00000000001775a8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam0000000000177598._0_1_ = '-';
    uRam0000000000177598._1_1_ = '-';
    uRam0000000000177598._2_1_ = '-';
    uRam0000000000177598._3_1_ = '-';
    uRam0000000000177598._4_1_ = '-';
    uRam0000000000177598._5_1_ = '-';
    uRam0000000000177598._6_1_ = '-';
    uRam0000000000177598._7_1_ = '-';
    DAT_001775df = 0;
  }
  uStack_28 = in_RAX;
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  uStack_28 = uStack_28 & 0xffffffffffffff;
  pIVar3 = Colour::impl();
  (**(code **)(*(long *)pIVar3 + 0x10))(pIVar3,1);
  printHeaderString(this,_name,0);
  Colour::~Colour((Colour *)((long)&uStack_28 + 7));
  return;
}

Assistant:

void printOpenHeader( std::string const& _name ) {
            stream  << getLineOfChars<'-'>() << "\n";
            {
                Colour colourGuard( Colour::Headers );
                printHeaderString( _name );
            }
        }